

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSet.cpp
# Opt level: O1

void __thiscall DIS::RecordSet::unmarshal(RecordSet *this,DataStream *dataStream)

{
  DataStream::operator>>(dataStream,&this->_recordID);
  DataStream::operator>>(dataStream,&this->_recordSetSerialNumber);
  DataStream::operator>>(dataStream,&this->_recordLength);
  DataStream::operator>>(dataStream,&this->_recordCount);
  DataStream::operator>>(dataStream,&this->_recordValues);
  DataStream::operator>>(dataStream,&this->_pad4);
  return;
}

Assistant:

void RecordSet::unmarshal(DataStream& dataStream)
{
    dataStream >> _recordID;
    dataStream >> _recordSetSerialNumber;
    dataStream >> _recordLength;
    dataStream >> _recordCount;
    dataStream >> _recordValues;
    dataStream >> _pad4;
}